

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_ComputeInnerForcing
              (ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int stage,sunrealtype cdiff)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int in_EDX;
  long in_RSI;
  double in_XMM0_Qa;
  double dVar5;
  N_Vector *Xvecs;
  sunrealtype *cvals;
  int retval;
  int nstore;
  int nmat;
  int k;
  int j;
  sunrealtype rcdiff;
  int local_40;
  int local_38;
  int local_34;
  
  lVar2 = *(long *)(in_RSI + 0x1a0);
  lVar3 = *(long *)(in_RSI + 0x1a8);
  local_40 = 0;
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    if ((*(int *)(in_RSI + 0x18) != 0) &&
       (-1 < *(int *)(*(long *)(in_RSI + 0x58) + (long)local_34 * 4))) {
      *(undefined8 *)(lVar3 + (long)local_40 * 8) =
           *(undefined8 *)
            (*(long *)(in_RSI + 0x28) +
            (long)*(int *)(*(long *)(in_RSI + 0x58) + (long)local_34 * 4) * 8);
      local_40 = local_40 + 1;
    }
    if ((*(int *)(in_RSI + 0x1c) != 0) &&
       (-1 < *(int *)(*(long *)(in_RSI + 0x58) + (long)local_34 * 4))) {
      *(undefined8 *)(lVar3 + (long)local_40 * 8) =
           *(undefined8 *)
            (*(long *)(in_RSI + 0x30) +
            (long)*(int *)(*(long *)(in_RSI + 0x58) + (long)local_34 * 4) * 8);
      local_40 = local_40 + 1;
    }
  }
  iVar1 = **(int **)(in_RSI + 0x38);
  dVar5 = 1.0 / in_XMM0_Qa;
  local_38 = 0;
  while( true ) {
    if (iVar1 <= local_38) {
      return 0;
    }
    local_40 = 0;
    for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
      if (-1 < *(int *)(*(long *)(in_RSI + 0x58) + (long)local_34 * 4)) {
        if ((*(int *)(in_RSI + 0x18) == 0) || (*(int *)(in_RSI + 0x1c) == 0)) {
          if (*(int *)(in_RSI + 0x18) == 0) {
            *(double *)(lVar2 + (long)local_40 * 8) =
                 dVar5 * *(double *)
                          (*(long *)(*(long *)(*(long *)(*(long *)(in_RSI + 0x38) + 0x20) +
                                              (long)local_38 * 8) + (long)in_EDX * 8) +
                          (long)local_34 * 8);
          }
          else {
            *(double *)(lVar2 + (long)local_40 * 8) =
                 dVar5 * *(double *)
                          (*(long *)(*(long *)(*(long *)(*(long *)(in_RSI + 0x38) + 0x18) +
                                              (long)local_38 * 8) + (long)in_EDX * 8) +
                          (long)local_34 * 8);
          }
          local_40 = local_40 + 1;
        }
        else {
          *(double *)(lVar2 + (long)local_40 * 8) =
               dVar5 * *(double *)
                        (*(long *)(*(long *)(*(long *)(*(long *)(in_RSI + 0x38) + 0x18) +
                                            (long)local_38 * 8) + (long)in_EDX * 8) +
                        (long)local_34 * 8);
          *(double *)(lVar2 + (long)(local_40 + 1) * 8) =
               dVar5 * *(double *)
                        (*(long *)(*(long *)(*(long *)(*(long *)(in_RSI + 0x38) + 0x20) +
                                            (long)local_38 * 8) + (long)in_EDX * 8) +
                        (long)local_34 * 8);
          local_40 = local_40 + 2;
        }
      }
    }
    iVar4 = N_VLinearCombination
                      (local_40,lVar2,lVar3,
                       *(undefined8 *)
                        (*(long *)(*(long *)(in_RSI + 0x158) + 0x18) + (long)local_38 * 8));
    if (iVar4 != 0) break;
    local_38 = local_38 + 1;
  }
  return -0x1c;
}

Assistant:

int mriStep_ComputeInnerForcing(SUNDIALS_MAYBE_UNUSED ARKodeMem ark_mem,
                                ARKodeMRIStepMem step_mem, int stage,
                                sunrealtype cdiff)
{
  sunrealtype rcdiff;
  int j, k, nmat, nstore, retval;
  sunrealtype* cvals;
  N_Vector* Xvecs;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* compute inner forcing vectors (assumes cdiff != 0) */
  nstore = 0;
  for (j = 0; j < stage; j++)
  {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1)
    {
      Xvecs[nstore] = step_mem->Fse[step_mem->stage_map[j]];
      nstore += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1)
    {
      Xvecs[nstore] = step_mem->Fsi[step_mem->stage_map[j]];
      nstore += 1;
    }
  }

  nmat   = step_mem->MRIC->nmat;
  rcdiff = ONE / cdiff;

  for (k = 0; k < nmat; k++)
  {
    nstore = 0;
    for (j = 0; j < stage; j++)
    {
      if (step_mem->stage_map[j] > -1)
      {
        if (step_mem->explicit_rhs && step_mem->implicit_rhs)
        {
          /* ImEx */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
        else if (step_mem->explicit_rhs)
        {
          /* explicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
        }
        else
        {
          /* implicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
      }
    }

    retval = N_VLinearCombination(nstore, cvals, Xvecs,
                                  step_mem->stepper->forcing[k]);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
  }

#ifdef SUNDIALS_LOGGING_EXTRA_DEBUG
  for (k = 0; k < nmat; k++)
  {
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_DEBUG,
                       "ARKODE::mriStep_ComputeInnerForcing", "forcing",
                       "forcing_%i(:) =", k);
    N_VPrintFile(step_mem->stepper->forcing[k], ARK_LOGGER->debug_fp);
  }
#endif

  return (ARK_SUCCESS);
}